

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_mgr.cxx
# Opt level: O2

void __thiscall nuraft::stat_mgr::reset_all_stats(stat_mgr *this)

{
  _Base_ptr p_Var1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->stat_map_lock_);
  for (p_Var1 = (this->stat_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->stat_map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    stat_elem::reset(*(stat_elem **)(p_Var1 + 2));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void stat_mgr::reset_all_stats() {
    std::unique_lock<std::mutex> l(stat_map_lock_);
    for (auto& entry: stat_map_) {
        stat_elem* elem = entry.second;
        elem->reset();
    }
}